

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.h
# Opt level: O2

optional<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
* __thiscall
viras::iter::
NatIter<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
::next(optional<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
       *__return_storage_ptr__,
      NatIter<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
      *this)

{
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  WStack_88;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  local_60;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  out;
  
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  ::WithConfig(&out.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
               ,(WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                 *)this);
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  ::WithConfig(&WStack_88,
               (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                *)this);
  sugar::operator+((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                    *)&local_60,
                   (Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                    *)&WStack_88,1);
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  ::operator=((WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
               *)this,&local_60);
  Kernel::RationalConstantType::~RationalConstantType(&local_60.inner);
  Kernel::RationalConstantType::~RationalConstantType(&WStack_88.inner);
  std::
  _Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
  ::
  _Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
            ((_Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
              *)__return_storage_ptr__,&out);
  Kernel::RationalConstantType::~RationalConstantType
            (&out.
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
              .inner);
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> next() {
        auto out = _cur;
        _cur = _cur + 1;
        return out;
      }